

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hashes.cpp
# Opt level: O0

size_t fibonacci(char *key,int len,uint32_t seed)

{
  uint8_t *endc;
  uint8_t *dc;
  size_t *endw;
  size_t *dw;
  size_t h;
  uint32_t seed_local;
  int len_local;
  char *key_local;
  
  h = (size_t)seed;
  for (dw = (size_t *)key; dw < key + ((long)len & 0xfffffffffffffff8); dw = dw + 1) {
    h = *dw * -0x61c8864680b583eb + h;
  }
  if ((len & 7U) != 0) {
    for (dc = (uint8_t *)dw; dc < key + len; dc = dc + 1) {
      h = (ulong)*dc * -0x61c8864680b583eb + h;
    }
  }
  return h;
}

Assistant:

size_t
fibonacci(const char *key, int len, uint32_t seed)
{
  size_t h = (size_t)seed;
  size_t *dw = (size_t *)key; //word stepper
  const size_t *const endw = &((const size_t*)key)[len/sizeof(size_t)];
  while (dw < endw) {
    h += *dw++ * UINT64_C(11400714819323198485);
  }
  if (len & (sizeof(size_t)-1)) {
    uint8_t *dc = (uint8_t*)dw; //byte stepper
    const uint8_t *const endc = &((const uint8_t*)key)[len];
    while (dc < endc) {
      h += *dc++ * UINT64_C(11400714819323198485);
    }
  }
  return h;
}